

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O1

Load * wasm::getSingleLoad(LocalGraph *localGraph,LocalGet *get,PassOptions *passOptions,
                          Module *module)

{
  _Base_ptr p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  Expression **ppEVar4;
  _Base_ptr p_Var5;
  LocalGet *pLVar6;
  LocalGet *pLVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<wasm::LocalGet_*>,_bool> pVar9;
  undefined1 local_80 [8];
  set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_> seen;
  LocalGet *local_48;
  LocalGet *parentGet;
  LocalGet *get_local;
  
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&seen;
  seen._M_t._M_impl._0_4_ = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  parentGet = get;
  std::
  _Rb_tree<wasm::LocalGet*,wasm::LocalGet*,std::_Identity<wasm::LocalGet*>,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>
  ::_M_insert_unique<wasm::LocalGet*const&>
            ((_Rb_tree<wasm::LocalGet*,wasm::LocalGet*,std::_Identity<wasm::LocalGet*>,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>
              *)local_80,&parentGet);
  seen._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)localGraph;
  do {
    pmVar3 = std::__detail::
             _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)localGraph,&parentGet);
    p_Var1 = (_Base_ptr)
             (pmVar3->
             super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var5 = p_Var1;
    if (p_Var1 == (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               (pmVar3->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
               ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var5 == (_Base_ptr)0x1) {
      p_Var5 = p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        p_Var5 = (pmVar3->
                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var5 = p_Var5 + 1;
      if (p_Var1 == (_Base_ptr)0x0) {
        p_Var5 = (_Base_ptr)
                 &(pmVar3->
                  super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
      }
      if (*(long *)p_Var5 == 0) goto LAB_0067a0ba;
      pLVar7 = *(LocalGet **)(*(long *)p_Var5 + 0x18);
      do {
        pLVar6 = pLVar7;
        local_48 = pLVar6;
        ppEVar4 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_48,passOptions,module,AllowTeeBrIf);
        pLVar7 = (LocalGet *)*ppEVar4;
      } while ((LocalGet *)*ppEVar4 != pLVar6);
      iVar2 = 0;
      pLVar7 = (LocalGet *)0x0;
      if ((pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id ==
          LocalGetId) {
        pLVar7 = pLVar6;
      }
      local_48 = pLVar7;
      if (pLVar7 != (LocalGet *)0x0) {
        pVar9 = std::
                _Rb_tree<wasm::LocalGet*,wasm::LocalGet*,std::_Identity<wasm::LocalGet*>,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>
                ::_M_emplace_unique<wasm::LocalGet*&>
                          ((_Rb_tree<wasm::LocalGet*,wasm::LocalGet*,std::_Identity<wasm::LocalGet*>,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>
                            *)local_80,&local_48);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          iVar2 = 1;
          get_local = (LocalGet *)0x0;
        }
        else {
          parentGet = local_48;
          iVar2 = 2;
        }
      }
      if (pLVar7 == (LocalGet *)0x0) {
        if ((pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
            LoadId) {
          pLVar6 = (LocalGet *)0x0;
        }
        iVar2 = 1;
        get_local = pLVar6;
      }
      bVar8 = iVar2 == 2;
      localGraph = (LocalGraph *)seen._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
LAB_0067a0ba:
      bVar8 = false;
      get_local = (LocalGet *)0x0;
    }
    if (!bVar8) {
      std::
      _Rb_tree<wasm::LocalGet_*,_wasm::LocalGet_*,_std::_Identity<wasm::LocalGet_*>,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
      ::~_Rb_tree((_Rb_tree<wasm::LocalGet_*,_wasm::LocalGet_*,_std::_Identity<wasm::LocalGet_*>,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                   *)local_80);
      return (Load *)get_local;
    }
  } while( true );
}

Assistant:

static Load* getSingleLoad(LocalGraph* localGraph,
                           LocalGet* get,
                           const PassOptions& passOptions,
                           Module& module) {
  std::set<LocalGet*> seen;
  seen.insert(get);
  while (1) {
    auto& sets = localGraph->getSetses[get];
    if (sets.size() != 1) {
      return nullptr;
    }
    auto* set = *sets.begin();
    if (!set) {
      return nullptr;
    }
    auto* value = Properties::getFallthrough(set->value, passOptions, module);
    if (auto* parentGet = value->dynCast<LocalGet>()) {
      if (seen.emplace(parentGet).second) {
        get = parentGet;
        continue;
      }
      // We are in a cycle of gets, in unreachable code.
      return nullptr;
    }
    if (auto* load = value->dynCast<Load>()) {
      return load;
    }
    return nullptr;
  }
}